

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitreader.h
# Opt level: O1

unsigned_long __thiscall LLVMBC::BitReader::fixed<unsigned_long>(BitReader *this,size_t bitWidth)

{
  byte scratch [8];
  unsigned_long local_10;
  
  local_10 = 0;
  if (bitWidth < 0x41) {
    ReadBits(this,bitWidth,(byte *)&local_10);
    return local_10;
  }
  __assert_fail("bitWidth <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                ,0x53,"T LLVMBC::BitReader::fixed(const size_t) [T = unsigned long]");
}

Assistant:

T fixed(const size_t bitWidth)
  {
    byte scratch[8] = {};

    assert(bitWidth <= 64);

    ReadBits(bitWidth, scratch);

    T ret;
    memcpy(&ret, scratch, sizeof(T));
    return ret;
  }